

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_buffer.c
# Opt level: O0

void test_init_read_buffer(void)

{
  cio_error cVar1;
  size_t sVar2;
  undefined1 local_30 [4];
  cio_error err;
  cio_read_buffer rb;
  uint32_t buffer;
  
  cVar1 = cio_read_buffer_init((cio_read_buffer *)local_30,(void *)((long)&rb.fetch_ptr + 4),4);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Read buffer was not initialized correctly!",0x35,UNITY_DISPLAY_STYLE_INT
            );
  sVar2 = cio_read_buffer_space_available((cio_read_buffer *)local_30);
  UnityAssertEqualNumber
            (4,sVar2,"Available space not initialized correctly!",0x36,UNITY_DISPLAY_STYLE_INT);
  sVar2 = cio_read_buffer_unread_bytes((cio_read_buffer *)local_30);
  UnityAssertEqualNumber
            (0,sVar2,"Unread bytes was not initialized correctly!",0x37,UNITY_DISPLAY_STYLE_INT);
  sVar2 = cio_read_buffer_size((cio_read_buffer *)local_30);
  UnityAssertEqualNumber
            (4,sVar2,"Size of read buffer not initialized correctly!",0x39,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_read_buffer(void)
{
	uint32_t buffer;
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(buffer), cio_read_buffer_space_available(&rb), "Available space not initialized correctly!");
	TEST_ASSERT_EQUAL_MESSAGE(0, cio_read_buffer_unread_bytes(&rb), "Unread bytes was not initialized correctly!");

	TEST_ASSERT_EQUAL_MESSAGE(sizeof(buffer), cio_read_buffer_size(&rb), "Size of read buffer not initialized correctly!");
}